

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O0

void __thiscall
helix::parity::pmd_handler::subscribe(pmd_handler *this,string *sym,size_t max_orders)

{
  long lVar1;
  ulong uVar2;
  string *in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helix::order_book>,_false,_true>,_bool>
  pVar4;
  size_type padding;
  order_book ob;
  order_book *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  string *this_00;
  uint64_t in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffeb9;
  order_book *in_stack_fffffffffffffec0;
  string local_118 [32];
  order_book local_f8;
  
  this_00 = local_118;
  std::__cxx11::string::string(this_00,in_RSI);
  order_book::order_book
            (in_stack_fffffffffffffec0,
             (string *)CONCAT71(in_stack_fffffffffffffeb9,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb0,(size_t)this_00);
  std::__cxx11::string::~string(local_118);
  order_book::set_state(&local_f8,trading);
  lVar1 = std::__cxx11::string::size();
  if (8 - lVar1 != 0) {
    uVar2 = std::__cxx11::string::size();
    std::__cxx11::string::insert((ulong)in_RSI,uVar2,(char)(8 - lVar1));
  }
  pVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_RDI,(value_type *)in_RSI);
  pVar4 = std::
          unordered_map<std::__cxx11::string,helix::order_book,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helix::order_book>>>
          ::emplace<std::__cxx11::string&,helix::order_book>
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helix::order_book,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helix::order_book>_>_>
                      *)pVar3.first._M_node._M_node,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(pVar3.second,in_stack_fffffffffffffe88),in_stack_fffffffffffffe80);
  order_book::~order_book
            ((order_book *)
             pVar4.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helix::order_book>,_true>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helix::order_book>,_true>
            );
  return;
}

Assistant:

void pmd_handler::subscribe(std::string sym, size_t max_orders)
{
    helix::order_book ob{sym, 0, max_orders};
    ob.set_state(trading_state::trading);
    auto padding = PMD_INSTRUMENT_LEN - sym.size();
    if (padding > 0) {
        sym.insert(sym.size(), padding, ' ');
    }
    _symbols.insert(sym);
    _order_book_id_map.emplace(sym, std::move(ob));
}